

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::extract_global_variables_from_function
          (CompilerMSL *this,uint32_t func_id,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *added_arg_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *global_var_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *processed_func_ids)

{
  Instruction *pIVar1;
  _Rb_tree_const_iterator<unsigned_int> __last;
  uint uVar2;
  BuiltIn BVar3;
  char cVar4;
  ushort uVar5;
  TypedID<(spirv_cross::Types)1> TVar6;
  _Hash_node_base *p_Var7;
  size_t sVar8;
  _Hash_node_base *p_Var9;
  Decoration *pDVar10;
  Parameter *pPVar11;
  undefined8 uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  TypeID TVar23;
  SPIRFunction *pSVar24;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var25;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  uint32_t uVar31;
  ID id;
  ExecutionModel EVar32;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *p_Var33;
  uint32_t *puVar34;
  __node_base_ptr p_Var35;
  SPIRExtension *pSVar36;
  size_type sVar37;
  SPIRBlock *pSVar38;
  SPIRType *pSVar39;
  mapped_type *pmVar40;
  mapped_type *pmVar41;
  SPIRVariable *pSVar42;
  CompilerError *this_00;
  TypedID<(spirv_cross::Types)6> *pTVar43;
  _Rb_tree_header *p_Var44;
  long lVar45;
  char *pcVar46;
  uint uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ParsedIR *pPVar51;
  uint32_t *puVar52;
  uint32_t *puVar53;
  __node_base_ptr p_Var54;
  __node_base_ptr p_Var55;
  Instruction *instr;
  bool bVar56;
  byte bVar57;
  uint32_t rvalue_id;
  uint32_t type_id;
  uint32_t ptr_type_id;
  __node_gen_type __node_gen;
  __hashtable *__h;
  ID local_fc;
  TypeID local_f8;
  key_type local_f4;
  SPIRBlock *local_f0;
  key_type local_e4;
  undefined1 local_e0 [16];
  undefined1 local_d0 [44];
  uint32_t local_a4;
  SPIRFunction *local_a0;
  ParsedIR *local_98;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *local_90;
  TypedID<(spirv_cross::Types)6> *local_88;
  uint32_t *local_80;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_78;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_70;
  uint32_t *local_68;
  uint32_t *local_60;
  SPIRType *local_58;
  key_type local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  bVar57 = 0;
  uVar50 = (processed_func_ids->_M_h)._M_bucket_count;
  uVar48 = (ulong)func_id % uVar50;
  p_Var54 = (processed_func_ids->_M_h)._M_buckets[uVar48];
  p_Var35 = (__node_base_ptr)0x0;
  if ((p_Var54 != (__node_base_ptr)0x0) &&
     (p_Var7 = p_Var54->_M_nxt, p_Var35 = p_Var54,
     *(uint32_t *)&p_Var54->_M_nxt[1]._M_nxt != func_id)) {
    while (p_Var54 = p_Var7, p_Var7 = p_Var54->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
      p_Var35 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar50 != uVar48) ||
         (p_Var35 = p_Var54, *(uint *)&p_Var7[1]._M_nxt == func_id)) goto LAB_00289f94;
    }
    p_Var35 = (__node_base_ptr)0x0;
  }
LAB_00289f94:
  local_a4 = func_id;
  local_70 = processed_func_ids;
  if ((p_Var35 == (__node_base_ptr)0x0) || (p_Var35->_M_nxt == (_Hash_node_base *)0x0)) {
    local_e0._0_8_ = processed_func_ids;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)processed_func_ids,&local_a4);
    local_a0 = Variant::get<spirv_cross::SPIRFunction>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + local_a4);
    sVar8 = (local_a0->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
            buffer_size;
    if (sVar8 != 0) {
      pTVar43 = (local_a0->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
                ptr;
      local_90 = (SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)(pTVar43 + sVar8);
      local_d0._32_8_ = &this->builtin_helper_invocation_id;
      local_68 = &this->builtin_subgroup_invocation_id_id;
      local_98 = (ParsedIR *)&this->builtin_subgroup_size_id;
      local_58 = (SPIRType *)&this->atomic_image_vars_emulated;
      local_78 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&this->builtin_frag_coord_id;
      local_80 = &this->builtin_layer_id;
      local_60 = &this->builtin_view_idx_id;
      do {
        local_88 = pTVar43;
        local_f0 = Variant::get<spirv_cross::SPIRBlock>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr + pTVar43->id);
        sVar8 = (local_f0->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
        if (sVar8 != 0) {
          instr = (local_f0->ops).super_VectorView<spirv_cross::Instruction>.ptr;
          pIVar1 = instr + sVar8;
LAB_0028a0c0:
          puVar34 = Compiler::stream((Compiler *)this,instr);
          uVar5 = instr->op;
          uVar47 = (uint)uVar5;
          if (0x156 < uVar5) {
            pPVar51 = (ParsedIR *)local_d0._32_8_;
            if (uVar5 < 0x1505) {
              if (uVar5 < 0x117f) {
                if (uVar5 - 0x1179 < 5) {
                  local_e0._0_4_ = *puVar34;
                  uVar50 = (global_var_ids->_M_h)._M_bucket_count;
                  uVar48 = (ulong)(uint)local_e0._0_4_ % uVar50;
                  p_Var54 = (global_var_ids->_M_h)._M_buckets[uVar48];
                  p_Var35 = (__node_base_ptr)0x0;
                  if (p_Var54 != (__node_base_ptr)0x0) {
                    uVar47 = *(uint *)&p_Var54->_M_nxt[1]._M_nxt;
                    p_Var7 = p_Var54->_M_nxt;
                    do {
                      p_Var35 = p_Var54;
                      p_Var54 = p_Var7;
                      if (local_e0._0_4_ == uVar47) break;
                      p_Var7 = p_Var54->_M_nxt;
                      if (p_Var7 == (_Hash_node_base *)0x0) goto LAB_0028aa28;
                      uVar47 = *(uint *)&p_Var7[1]._M_nxt;
                      p_Var35 = (__node_base_ptr)0x0;
                    } while ((ulong)uVar47 % uVar50 == uVar48);
                  }
                  goto LAB_0028aa2a;
                }
                pPVar51 = local_98;
                if (uVar47 - 0x157 < 2) goto LAB_0028aa3e;
              }
              else {
                if (uVar5 == 0x117f) goto LAB_0028a0fd;
                if (((uVar5 == 0x1504) &&
                    ((this->msl_options).manual_helper_invocation_updates == true)) &&
                   (0x4f4b < (this->msl_options).msl_version)) {
                  cVar4 = this->needs_helper_invocation;
                  goto joined_r0x0028a99b;
                }
              }
            }
            else {
              if (uVar5 - 0x1780 < 0x11) {
LAB_0028a0fd:
                local_e0._0_4_ = puVar34[2];
                uVar50 = (global_var_ids->_M_h)._M_bucket_count;
                uVar48 = (ulong)(uint)local_e0._0_4_ % uVar50;
                p_Var54 = (global_var_ids->_M_h)._M_buckets[uVar48];
                p_Var35 = (__node_base_ptr)0x0;
                if (p_Var54 != (__node_base_ptr)0x0) {
                  uVar47 = *(uint *)&p_Var54->_M_nxt[1]._M_nxt;
                  p_Var55 = p_Var54->_M_nxt;
                  do {
                    p_Var35 = p_Var54;
                    if (local_e0._0_4_ == uVar47) break;
                    p_Var7 = p_Var55->_M_nxt;
                    if (p_Var7 == (_Hash_node_base *)0x0) goto LAB_0028aa28;
                    uVar47 = *(uint *)&p_Var7[1]._M_nxt;
                    p_Var35 = (__node_base_ptr)0x0;
                    p_Var54 = p_Var55;
                    p_Var55 = p_Var7;
                  } while ((ulong)uVar47 % uVar50 == uVar48);
                }
                goto LAB_0028aa2a;
              }
              if (uVar47 == 0x1505) {
                if (((this->msl_options).manual_helper_invocation_updates == true) &&
                   (0x4f4b < (this->msl_options).msl_version)) goto LAB_0028aa3e;
              }
              else if (uVar47 == 0x1793) goto LAB_0028a194;
            }
            goto switchD_0028a281_caseD_3a;
          }
          if (0xe3 < uVar5) {
            if ((0xe < uVar5 - 0xe4) || (uVar5 - 0xe4 == 3)) {
              pPVar51 = (ParsedIR *)local_68;
              if ((uVar5 == 0x154) ||
                 ((uVar5 == 0x156 && ((puVar34[3] - 1 < 2 || (pPVar51 = local_98, puVar34[3] == 0)))
                  ))) goto LAB_0028aa3e;
              goto switchD_0028a281_caseD_3a;
            }
LAB_0028a194:
            EVar32 = Compiler::get_execution_model((Compiler *)this);
            if ((((EVar32 == ExecutionModelFragment) && (0x4f4b < (this->msl_options).msl_version))
                && ((this->msl_options).check_discarded_frag_stores == true)) &&
               (this->frag_shader_needs_discard_checks == true)) {
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,(uint *)local_d0._32_8_);
            }
            if ((uVar47 != 99) && (uVar5 != 0xe4)) {
              puVar34 = puVar34 + 2;
            }
            uVar47 = *puVar34;
            local_e0._0_8_ = CONCAT44(SUB84(local_e0._0_8_,4),uVar47);
            uVar50 = (global_var_ids->_M_h)._M_bucket_count;
            uVar48 = (ulong)uVar47 % uVar50;
            p_Var54 = (global_var_ids->_M_h)._M_buckets[uVar48];
            p_Var35 = (__node_base_ptr)0x0;
            if (p_Var54 != (__node_base_ptr)0x0) {
              uVar2 = *(uint *)&p_Var54->_M_nxt[1]._M_nxt;
              p_Var7 = p_Var54->_M_nxt;
              do {
                p_Var35 = p_Var54;
                if (uVar47 == uVar2) break;
                p_Var9 = p_Var7->_M_nxt;
                if (p_Var9 == (_Hash_node_base *)0x0) goto LAB_0028aa28;
                uVar2 = *(uint *)&p_Var9[1]._M_nxt;
                p_Var35 = (__node_base_ptr)0x0;
                p_Var54 = p_Var7;
                p_Var7 = p_Var9;
              } while ((ulong)uVar2 % uVar50 == uVar48);
            }
            goto LAB_0028aa2a;
          }
          if (0x62 < uVar5) {
            if (uVar5 == 99) goto LAB_0028a194;
            if (uVar5 == 0xa9) {
              local_e0._0_4_ = puVar34[3];
              uVar50 = (global_var_ids->_M_h)._M_bucket_count;
              uVar48 = (ulong)(uint)local_e0._0_4_ % uVar50;
              p_Var54 = (global_var_ids->_M_h)._M_buckets[uVar48];
              p_Var35 = (__node_base_ptr)0x0;
              if ((p_Var54 != (__node_base_ptr)0x0) &&
                 (p_Var35 = p_Var54, p_Var55 = p_Var54->_M_nxt,
                 local_e0._0_4_ != *(BuiltIn *)&p_Var54->_M_nxt[1]._M_nxt)) {
                while (p_Var7 = p_Var55->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
                  p_Var35 = (__node_base_ptr)0x0;
                  if (((ulong)*(BuiltIn *)&p_Var7[1]._M_nxt % uVar50 != uVar48) ||
                     (p_Var35 = p_Var55, p_Var55 = p_Var7,
                     local_e0._0_4_ == *(BuiltIn *)&p_Var7[1]._M_nxt)) goto LAB_0028a9b1;
                }
                p_Var35 = (__node_base_ptr)0x0;
              }
LAB_0028a9b1:
              if ((p_Var35 != (__node_base_ptr)0x0) && (p_Var35->_M_nxt != (_Hash_node_base *)0x0))
              {
                ::std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_insert_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)added_arg_ids,(uint *)local_e0);
              }
              local_e0._0_4_ = puVar34[4];
              uVar50 = (global_var_ids->_M_h)._M_bucket_count;
              uVar48 = (ulong)(uint)local_e0._0_4_ % uVar50;
              p_Var54 = (global_var_ids->_M_h)._M_buckets[uVar48];
              p_Var35 = (__node_base_ptr)0x0;
              if (p_Var54 != (__node_base_ptr)0x0) {
                uVar47 = *(uint *)&p_Var54->_M_nxt[1]._M_nxt;
                p_Var7 = p_Var54->_M_nxt;
                do {
                  p_Var35 = p_Var54;
                  if (local_e0._0_4_ == uVar47) break;
                  p_Var9 = p_Var7->_M_nxt;
                  if (p_Var9 == (_Hash_node_base *)0x0) goto LAB_0028aa28;
                  uVar47 = *(uint *)&p_Var9[1]._M_nxt;
                  p_Var35 = (__node_base_ptr)0x0;
                  p_Var54 = p_Var7;
                  p_Var7 = p_Var9;
                } while ((ulong)uVar47 % uVar50 == uVar48);
              }
              goto LAB_0028aa2a;
            }
            goto switchD_0028a281_caseD_3a;
          }
          switch(uVar5) {
          case 0x39:
            if (3 < instr->length) {
              uVar50 = 3;
              do {
                uVar47 = puVar34[uVar50];
                local_e0._0_4_ = uVar47;
                uVar48 = (global_var_ids->_M_h)._M_bucket_count;
                uVar49 = (ulong)uVar47 % uVar48;
                p_Var54 = (global_var_ids->_M_h)._M_buckets[uVar49];
                p_Var35 = (__node_base_ptr)0x0;
                if ((p_Var54 != (__node_base_ptr)0x0) &&
                   (p_Var35 = p_Var54, p_Var55 = p_Var54->_M_nxt,
                   uVar47 != *(uint *)&p_Var54->_M_nxt[1]._M_nxt)) {
                  while (p_Var7 = p_Var55->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
                    p_Var35 = (__node_base_ptr)0x0;
                    if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar48 != uVar49) ||
                       (p_Var35 = p_Var55, p_Var55 = p_Var7, uVar47 == *(uint *)&p_Var7[1]._M_nxt))
                    goto LAB_0028a6c6;
                  }
                  p_Var35 = (__node_base_ptr)0x0;
                }
LAB_0028a6c6:
                if ((p_Var35 != (__node_base_ptr)0x0) && (p_Var35->_M_nxt != (_Hash_node_base *)0x0)
                   ) {
                  ::std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::_M_insert_unique<unsigned_int_const&>
                            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)added_arg_ids,(uint *)local_e0);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 < instr->length);
            }
            local_e0._8_8_ = local_e0._8_8_ & 0xffffffff00000000;
            local_d0._0_8_ = (_Base_ptr)0x0;
            __last._M_node = (_Base_ptr)(local_e0 + 8);
            local_d0._24_8_ = 0;
            local_d0._8_8_ = __last._M_node;
            local_d0._16_8_ = __last._M_node;
            extract_global_variables_from_function
                      (this,puVar34[2],
                       (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       local_e0,global_var_ids,local_70);
            ::std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<unsigned_int>>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)added_arg_ids,(_Rb_tree_const_iterator<unsigned_int>)local_d0._8_8_,__last
                      );
            ::std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)local_e0);
            break;
          case 0x3a:
          case 0x3b:
          case 0x3f:
          case 0x40:
            break;
          case 0x3c:
            local_e0._0_4_ = puVar34[2];
            pSVar42 = Compiler::maybe_get_backing_variable((Compiler *)this,puVar34[2]);
            if (pSVar42 != (SPIRVariable *)0x0) {
              local_fc.id = (pSVar42->super_IVariant).self.id;
              sVar37 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)local_58,&local_fc.id);
              if ((sVar37 != 0) &&
                 (pSVar39 = Variant::get<spirv_cross::SPIRType>
                                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr +
                                       *(uint *)&(pSVar42->super_IVariant).field_0xc),
                 (pSVar39->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
                this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError
                          (this_00,
                           "Cannot emulate array of storage images with atomics. Use MSL 3.1 for native support."
                          );
                __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              uVar50 = (global_var_ids->_M_h)._M_bucket_count;
              uVar48 = (local_e0._0_8_ & 0xffffffff) % uVar50;
              p_Var54 = (global_var_ids->_M_h)._M_buckets[uVar48];
              p_Var35 = (__node_base_ptr)0x0;
              if (p_Var54 != (__node_base_ptr)0x0) {
                BVar3 = *(BuiltIn *)&p_Var54->_M_nxt[1]._M_nxt;
                p_Var7 = p_Var54->_M_nxt;
                do {
                  p_Var35 = p_Var54;
                  if (local_e0._0_4_ == BVar3) break;
                  p_Var9 = p_Var7->_M_nxt;
                  if (p_Var9 == (_Hash_node_base *)0x0) goto LAB_0028aa28;
                  BVar3 = *(BuiltIn *)&p_Var9[1]._M_nxt;
                  p_Var35 = (__node_base_ptr)0x0;
                  p_Var54 = p_Var7;
                  p_Var7 = p_Var9;
                } while ((ulong)BVar3 % uVar50 == uVar48);
              }
              goto LAB_0028aa2a;
            }
            break;
          case 0x3d:
          case 0x41:
          case 0x42:
          case 0x43:
          case 0x44:
            local_e0._0_4_ = puVar34[2];
            uVar50 = (global_var_ids->_M_h)._M_bucket_count;
            uVar48 = (ulong)(uint)local_e0._0_4_ % uVar50;
            p_Var54 = (global_var_ids->_M_h)._M_buckets[uVar48];
            p_Var35 = (__node_base_ptr)0x0;
            if ((p_Var54 != (__node_base_ptr)0x0) &&
               (p_Var35 = p_Var54, p_Var55 = p_Var54->_M_nxt,
               local_e0._0_4_ != *(uint *)&p_Var54->_M_nxt[1]._M_nxt)) {
              while (p_Var7 = p_Var55->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
                p_Var35 = (__node_base_ptr)0x0;
                if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar50 != uVar48) ||
                   (p_Var35 = p_Var55, p_Var55 = p_Var7,
                   local_e0._0_4_ == *(uint *)&p_Var7[1]._M_nxt)) goto LAB_0028a774;
              }
              p_Var35 = (__node_base_ptr)0x0;
            }
LAB_0028a774:
            if ((p_Var35 != (__node_base_ptr)0x0) && (p_Var35->_M_nxt != (_Hash_node_base *)0x0)) {
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,(uint *)local_e0);
            }
            pSVar39 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + *puVar34);
            if (((pSVar39->basetype != Image) || ((pSVar39->image).dim != DimSubpassData)) ||
               ((this->msl_options).use_framebuffer_fetch_subpasses != false)) break;
            if (*(uint32_t *)local_78 == 0) {
              __assert_fail("builtin_frag_coord_id != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                            ,0x750,
                            "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                           );
            }
            ::std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)added_arg_ids,(uint *)local_78);
            if ((this->msl_options).multiview == true) {
              pPVar51 = (ParsedIR *)local_60;
              if (*local_60 == 0) {
                __assert_fail("builtin_view_idx_id != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                              ,0x755,
                              "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                             );
              }
            }
            else {
              if ((this->msl_options).arrayed_subpass_input != true) break;
              pPVar51 = (ParsedIR *)local_80;
              if (*local_80 == 0) {
                __assert_fail("builtin_layer_id != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                              ,0x75b,
                              "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                             );
              }
            }
            goto LAB_0028aa3e;
          case 0x3e:
            local_e0._0_4_ = *puVar34;
            uVar50 = (global_var_ids->_M_h)._M_bucket_count;
            uVar48 = (ulong)(uint)local_e0._0_4_ % uVar50;
            p_Var54 = (global_var_ids->_M_h)._M_buckets[uVar48];
            p_Var35 = (__node_base_ptr)0x0;
            if ((p_Var54 != (__node_base_ptr)0x0) &&
               (p_Var35 = p_Var54, p_Var55 = p_Var54->_M_nxt,
               local_e0._0_4_ != *(uint *)&p_Var54->_M_nxt[1]._M_nxt)) {
              while (p_Var7 = p_Var55->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
                p_Var35 = (__node_base_ptr)0x0;
                if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar50 != uVar48) ||
                   (p_Var35 = p_Var55, p_Var55 = p_Var7,
                   local_e0._0_4_ == *(uint *)&p_Var7[1]._M_nxt)) goto LAB_0028a8b2;
              }
              p_Var35 = (__node_base_ptr)0x0;
            }
LAB_0028a8b2:
            if ((((p_Var35 != (__node_base_ptr)0x0) && (p_Var35->_M_nxt != (_Hash_node_base *)0x0))
                && (::std::
                    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    ::_M_insert_unique<unsigned_int_const&>
                              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)added_arg_ids,(uint *)local_e0),
                   (this->msl_options).input_attachment_is_ds_attachment == true)) &&
               (local_e0._0_4_ == this->builtin_frag_depth_id)) {
              this->writes_to_depth = true;
            }
            local_fc.id = puVar34[1];
            uVar50 = (global_var_ids->_M_h)._M_bucket_count;
            uVar48 = (ulong)local_fc.id % uVar50;
            p_Var54 = (global_var_ids->_M_h)._M_buckets[uVar48];
            p_Var35 = (__node_base_ptr)0x0;
            if ((p_Var54 != (__node_base_ptr)0x0) &&
               (p_Var35 = p_Var54, p_Var55 = p_Var54->_M_nxt,
               local_fc.id != *(uint *)&p_Var54->_M_nxt[1]._M_nxt)) {
              while (p_Var7 = p_Var55->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
                p_Var35 = (__node_base_ptr)0x0;
                if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar50 != uVar48) ||
                   (p_Var35 = p_Var55, p_Var55 = p_Var7, local_fc.id == *(uint *)&p_Var7[1]._M_nxt))
                goto LAB_0028a94a;
              }
              p_Var35 = (__node_base_ptr)0x0;
            }
LAB_0028a94a:
            if ((p_Var35 != (__node_base_ptr)0x0) && (p_Var35->_M_nxt != (_Hash_node_base *)0x0)) {
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,&local_fc.id);
            }
            EVar32 = Compiler::get_execution_model((Compiler *)this);
            if (((EVar32 == ExecutionModelFragment) && (0x4f4b < (this->msl_options).msl_version))
               && ((this->msl_options).check_discarded_frag_stores == true)) {
              cVar4 = this->frag_shader_needs_discard_checks;
              pPVar51 = (ParsedIR *)local_d0._32_8_;
joined_r0x0028a99b:
              local_d0._32_8_ = pPVar51;
              if (cVar4 == '\x01') goto LAB_0028aa3e;
            }
            break;
          default:
            if ((uVar5 == 0xc) &&
               (pSVar36 = Variant::get<spirv_cross::SPIRExtension>
                                    ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                     super_VectorView<spirv_cross::Variant>.ptr + puVar34[2]),
               *(int *)&(pSVar36->super_IVariant).field_0xc == 1)) {
              uVar31 = puVar34[3];
              if (uVar31 - 0x4c < 3) {
                local_e0._0_4_ = (this->stage_in_var_id).id;
                ::std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::_M_insert_unique<unsigned_int>(&added_arg_ids->_M_t,(uint *)local_e0);
              }
              else if ((uVar31 == 0x23) || (uVar31 == 0x33)) {
                local_e0._0_4_ = puVar34[5];
                uVar50 = (global_var_ids->_M_h)._M_bucket_count;
                uVar48 = (ulong)(uint)local_e0._0_4_ % uVar50;
                p_Var54 = (global_var_ids->_M_h)._M_buckets[uVar48];
                p_Var35 = (__node_base_ptr)0x0;
                if (p_Var54 != (__node_base_ptr)0x0) {
                  uVar47 = *(uint *)&p_Var54->_M_nxt[1]._M_nxt;
                  p_Var7 = p_Var54->_M_nxt;
                  do {
                    p_Var35 = p_Var54;
                    if (local_e0._0_4_ == uVar47) break;
                    p_Var9 = p_Var7->_M_nxt;
                    if (p_Var9 == (_Hash_node_base *)0x0) goto LAB_0028aa28;
                    uVar47 = *(uint *)&p_Var9[1]._M_nxt;
                    p_Var35 = (__node_base_ptr)0x0;
                    p_Var54 = p_Var7;
                    p_Var7 = p_Var9;
                  } while ((ulong)uVar47 % uVar50 == uVar48);
                }
                goto LAB_0028aa2a;
              }
            }
          }
          goto switchD_0028a281_caseD_3a;
        }
LAB_0028aa8a:
        pTVar43 = local_88 + 1;
      } while ((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)pTVar43 != local_90);
    }
    p_Var33 = &::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->function_global_vars,&local_a4)->_M_t;
    ::std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(p_Var33,&added_arg_ids->_M_t);
    if (local_a4 != (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
      local_d0._32_8_ = (added_arg_ids->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var44 = &(added_arg_ids->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)local_d0._32_8_ != p_Var44) {
        local_98 = &(this->super_CompilerGLSL).super_Compiler.ir;
        local_90 = &local_a0->arguments;
        local_78 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
        local_80 = (uint32_t *)0x0;
        local_48 = 0;
        local_40 = 0;
        local_38 = 0;
        do {
          local_fc.id = ((_Base_ptr)(local_d0._32_8_ + 0x20))->_M_color;
          pSVar38 = (SPIRBlock *)
                    Variant::get<spirv_cross::SPIRVariable>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + local_fc.id);
          local_f8.id = *(uint32_t *)&(pSVar38->super_IVariant).field_0xc;
          pSVar39 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + local_f8.id);
          uVar31 = Compiler::get_decoration((Compiler *)this,local_fc,BuiltIn);
          local_88 = (TypedID<(spirv_cross::Types)6> *)CONCAT44(local_88._4_4_,uVar31);
          bVar27 = Compiler::has_decoration((Compiler *)this,local_fc,DecorationPatch);
          bVar28 = true;
          if (!bVar27) {
            bVar28 = is_patch_block(this,pSVar39);
          }
          bVar27 = Compiler::has_decoration
                             ((Compiler *)this,(ID)(pSVar39->super_IVariant).self.id,Block);
          if (bVar28 == false) {
            bVar29 = Compiler::is_tessellation_shader((Compiler *)this);
            if ((!bVar29) || (bVar29 = true, pSVar38->merge != MergeLoop)) {
              EVar32 = Compiler::get_execution_model((Compiler *)this);
              if (EVar32 != ExecutionModelTessellationControl) goto LAB_0028abd2;
              bVar29 = pSVar38->merge == (MergeSelection|MergeLoop);
            }
          }
          else {
LAB_0028abd2:
            bVar29 = false;
          }
          if ((bVar27 & bVar28) == 1) {
            bVar27 = pSVar38->merge == (MergeSelection|MergeLoop);
          }
          else {
            bVar27 = false;
          }
          local_f0 = pSVar38;
          bVar30 = Compiler::is_builtin_variable((Compiler *)this,(SPIRVariable *)pSVar38);
          pSVar38 = local_f0;
          bVar56 = true;
          if ((bVar30) && ((4 < (uint)local_88 || ((0x1bU >> ((uint)local_88 & 0x1f) & 1) == 0)))) {
            bVar56 = pSVar39->basetype == Struct;
          }
          bVar56 = (bool)((bVar29 | bVar27) & bVar56);
          if ((bVar56) && (local_f0->merge == (MergeSelection|MergeLoop))) {
            bVar56 = CompilerGLSL::is_stage_output_variable_masked
                               (&this->super_CompilerGLSL,(SPIRVariable *)local_f0);
            bVar56 = !bVar56;
          }
          if (bVar56) {
            local_e0._0_8_ = local_d0;
            local_e0._8_8_ = 0;
            local_d0._0_8_ = local_d0._0_8_ & 0xffffffffffffff00;
            if (bVar28 == false) {
              pcVar46 = "gl_out";
              if (pSVar38->merge == MergeLoop) {
                pcVar46 = "gl_in";
              }
              ::std::__cxx11::string::_M_replace((ulong)local_e0,0,(char *)0x0,(ulong)pcVar46);
            }
            else {
              ::std::__cxx11::string::_M_assign((string *)local_e0);
            }
            if (((pSVar38->merge == (MergeSelection|MergeLoop)) &&
                (bVar27 = Compiler::has_decoration
                                    ((Compiler *)this,(ID)(pSVar39->super_IVariant).self.id,Block),
                bVar27)) &&
               ((int)(pSVar39->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size != 0
               )) {
              uVar31 = 0;
              do {
                bVar27 = CompilerGLSL::is_stage_output_block_member_masked
                                   (&this->super_CompilerGLSL,(SPIRVariable *)pSVar38,uVar31,true);
                pSVar24 = local_a0;
                if (bVar27) {
                  uVar50 = *(ulong *)&(local_f0->super_IVariant).self;
                  uVar50 = uVar50 << 0x20 | uVar50 >> 0x20;
                  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                            (local_90,(local_a0->arguments).
                                      super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                                      buffer_size + 1);
                  pPVar11 = (pSVar24->arguments).
                            super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
                  sVar8 = (pSVar24->arguments).
                          super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                  pPVar11[sVar8].type = (TypeID)(int)uVar50;
                  pPVar11[sVar8].id = (ID)(int)(uVar50 >> 0x20);
                  pPVar11[sVar8].read_count = 0;
                  pPVar11[sVar8].write_count = 0;
                  pPVar11[sVar8].alias_global_variable = true;
                  (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                  buffer_size = sVar8 + 1;
                  pSVar38 = local_f0;
                  break;
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 < (uint)(pSVar39->member_types).
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                      .buffer_size);
            }
            if (pSVar38->merge == (MergeSelection|MergeLoop)) {
              uVar47 = (uint)(byte)local_48;
              if (bVar28 != false) {
                uVar47 = (uint)(byte)local_38;
              }
              if ((uVar47 & 1) == 0) {
                local_fc.id = this->next_metal_resource_ids[(ulong)(bVar28 ^ 1) * 2 + 0xb];
                uVar47 = 1;
                local_38 = (ulong)(uint)(byte)local_38;
                if (bVar28 != false) {
                  local_38 = 1;
                  uVar47 = (uint)(byte)local_48;
                }
                local_48 = (ulong)uVar47;
                goto LAB_0028b280;
              }
            }
            else {
              if (pSVar38->merge == MergeLoop) {
                uVar47 = (uint)(byte)local_80;
                if (bVar28 != false) {
                  uVar47 = (uint)(byte)local_40;
                }
                if ((uVar47 & 1) != 0) goto LAB_0028b35d;
                local_fc.id = this->next_metal_resource_ids[(ulong)(bVar28 ^ 1) * 2 + 10];
                uVar47 = 1;
                local_40 = (ulong)(uint)(byte)local_40;
                if (bVar28 != false) {
                  local_40 = 1;
                  uVar47 = (uint)(byte)local_80;
                }
                local_80 = (uint32_t *)(ulong)uVar47;
              }
LAB_0028b280:
              pSVar42 = Variant::get<spirv_cross::SPIRVariable>
                                  ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr + local_fc.id);
              local_f8.id = *(uint32_t *)&(pSVar42->super_IVariant).field_0xc;
              id.id = ParsedIR::increase_bound_by(local_98,1);
              pSVar24 = local_a0;
              TVar23.id = local_f8.id;
              SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                        (local_90,(local_a0->arguments).
                                  super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
                                  + 1);
              pPVar11 = (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                        ptr;
              sVar8 = (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                      buffer_size;
              pPVar11[sVar8].type.id = TVar23.id;
              pPVar11[sVar8].id.id = id.id;
              pPVar11[sVar8].read_count = 0;
              pPVar11[sVar8].write_count = 0;
              pPVar11[sVar8].alias_global_variable = true;
              (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
              buffer_size = sVar8 + 1;
              local_f4.id = 7;
              local_e4.id = 0;
              Compiler::
              set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                        ((Compiler *)this,id.id,&local_f8.id,&local_f4.id,(int *)&local_e4,
                         &local_fc.id);
              Compiler::set_name((Compiler *)this,id,(string *)local_e0);
              pSVar38 = local_f0;
              EVar32 = Compiler::get_execution_model((Compiler *)this);
              if (((EVar32 == ExecutionModelTessellationEvaluation) &&
                  ((this->msl_options).raw_buffer_tese_input == true)) &&
                 (pSVar38->merge == MergeLoop)) {
                Compiler::set_decoration((Compiler *)this,id,DecorationNonWritable,0);
              }
            }
LAB_0028b35d:
            if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_e0._0_8_ !=
                (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_d0) {
              operator_delete((void *)local_e0._0_8_);
            }
          }
          else if ((bVar30) &&
                  (bVar27 = Compiler::has_decoration
                                      ((Compiler *)this,(ID)(pSVar39->super_IVariant).self.id,Block)
                  , bVar27)) {
            local_f8.id = Compiler::get_pointee_type_id((Compiler *)this,local_f8.id);
            pSVar39 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + local_f8.id);
            sVar8 = (pSVar39->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
            if (sVar8 != 0) {
              local_60 = &((pSVar39->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr)->id;
              puVar34 = (uint32_t *)(sVar8 << 2);
              uVar50 = 0;
              local_58 = pSVar39;
              do {
                local_e0._0_4_ = 0x7fffffff;
                bVar27 = Compiler::is_member_builtin
                                   ((Compiler *)this,pSVar39,(uint32_t)uVar50,(BuiltIn *)local_e0);
                if (bVar27) {
                  bVar27 = Compiler::has_active_builtin
                                     ((Compiler *)this,local_e0._0_4_,local_f0->merge);
                  if (bVar27) {
                    local_68 = puVar34;
                    uVar31 = ParsedIR::increase_bound_by(local_98,2);
                    puVar34 = local_60;
                    local_88 = (TypedID<(spirv_cross::Types)6> *)CONCAT44(local_88._4_4_,uVar31 + 1)
                    ;
                    local_f4.id = uVar31;
                    pSVar39 = Variant::get<spirv_cross::SPIRType>
                                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                         super_VectorView<spirv_cross::Variant>.ptr +
                                         local_60[uVar50]);
                    pSVar39 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                                        ((Compiler *)this,uVar31,pSVar39);
                    pSVar24 = local_a0;
                    (pSVar39->super_IVariant).self.id = puVar34[uVar50];
                    pSVar39->storage = local_f0->merge;
                    pSVar39->pointer = true;
                    pSVar39->pointer_depth = pSVar39->pointer_depth + 1;
                    (pSVar39->parent_type).id = puVar34[uVar50];
                    TVar6.id = puVar34[uVar50];
                    SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                              (local_90,(local_a0->arguments).
                                        super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                                        buffer_size + 1);
                    pPVar11 = (pSVar24->arguments).
                              super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
                    sVar8 = (pSVar24->arguments).
                            super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                    pPVar11[sVar8].type.id = TVar6.id;
                    uVar31 = (uint)local_88;
                    pPVar11[sVar8].id.id = (uint)local_88;
                    pPVar11[sVar8].read_count = 0;
                    pPVar11[sVar8].write_count = 0;
                    pPVar11[sVar8].alias_global_variable = true;
                    (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                    buffer_size = sVar8 + 1;
                    local_e4.id = 7;
                    Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                              ((Compiler *)this,(uint)local_88,&local_f4.id,&local_e4.id);
                    p_Var25 = local_78;
                    local_e4.id = local_f8.id;
                    pmVar40 = ::std::__detail::
                              _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              ::operator[](local_78,&local_e4);
                    pDVar10 = (pmVar40->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr
                    ;
                    local_70 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)((uVar50 & 0xffffffff) * 0x188);
                    pmVar40 = (mapped_type *)((long)&(local_70->_M_h)._M_buckets + (long)pDVar10);
                    local_4c.id = uVar31;
                    pmVar41 = ::std::__detail::
                              _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              ::operator[](p_Var25,&local_4c);
                    ::std::__cxx11::string::_M_assign((string *)pmVar41);
                    puVar26 = local_70;
                    ::std::__cxx11::string::_M_assign
                              ((string *)&(pmVar41->decoration).qualified_alias);
                    ::std::__cxx11::string::_M_assign
                              ((string *)&(pmVar41->decoration).hlsl_semantic);
                    ::std::__cxx11::string::_M_assign((string *)&(pmVar41->decoration).user_type);
                    (pmVar41->decoration).decoration_flags.lower =
                         *(uint64_t *)
                          ((long)&(pDVar10->alias)._M_dataplus._M_p +
                          (long)&puVar26[2]._M_h._M_before_begin._M_nxt);
                    if (pmVar40 == pmVar41) {
                      BVar3 = (pmVar40->decoration).builtin_type;
                      uVar20 = (pmVar40->decoration).location;
                      uVar21 = (pmVar40->decoration).component;
                      uVar22 = (pmVar40->decoration).set;
                      uVar16 = (pmVar40->decoration).binding;
                      uVar17 = (pmVar40->decoration).offset;
                      uVar18 = (pmVar40->decoration).xfb_buffer;
                      uVar19 = (pmVar40->decoration).xfb_stride;
                      uVar31 = (pmVar40->decoration).stream;
                      uVar13 = (pmVar40->decoration).array_stride;
                      uVar14 = (pmVar40->decoration).matrix_stride;
                      uVar15 = (pmVar40->decoration).input_attachment;
                      uVar12 = *(undefined8 *)((long)&(pmVar40->decoration).index + 2);
                      *(undefined8 *)((long)&(pmVar41->decoration).input_attachment + 2) =
                           *(undefined8 *)((long)&(pmVar40->decoration).input_attachment + 2);
                      *(undefined8 *)((long)&(pmVar41->decoration).index + 2) = uVar12;
                      (pmVar41->decoration).stream = uVar31;
                      (pmVar41->decoration).array_stride = uVar13;
                      (pmVar41->decoration).matrix_stride = uVar14;
                      (pmVar41->decoration).input_attachment = uVar15;
                      (pmVar41->decoration).binding = uVar16;
                      (pmVar41->decoration).offset = uVar17;
                      (pmVar41->decoration).xfb_buffer = uVar18;
                      (pmVar41->decoration).xfb_stride = uVar19;
                      (pmVar41->decoration).builtin_type = BVar3;
                      (pmVar41->decoration).location = uVar20;
                      (pmVar41->decoration).component = uVar21;
                      (pmVar41->decoration).set = uVar22;
                      (pmVar41->decoration).extended.flags.lower =
                           (pmVar40->decoration).extended.flags.lower;
                    }
                    else {
                      ::std::
                      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      ::
                      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                  *)&(pmVar41->decoration).decoration_flags.higher,
                                 &(pmVar40->decoration).decoration_flags.higher._M_h);
                      BVar3 = (pmVar40->decoration).builtin_type;
                      uVar20 = (pmVar40->decoration).location;
                      uVar21 = (pmVar40->decoration).component;
                      uVar22 = (pmVar40->decoration).set;
                      uVar16 = (pmVar40->decoration).binding;
                      uVar17 = (pmVar40->decoration).offset;
                      uVar18 = (pmVar40->decoration).xfb_buffer;
                      uVar19 = (pmVar40->decoration).xfb_stride;
                      uVar31 = (pmVar40->decoration).stream;
                      uVar13 = (pmVar40->decoration).array_stride;
                      uVar14 = (pmVar40->decoration).matrix_stride;
                      uVar15 = (pmVar40->decoration).input_attachment;
                      uVar12 = *(undefined8 *)((long)&(pmVar40->decoration).index + 2);
                      *(undefined8 *)((long)&(pmVar41->decoration).input_attachment + 2) =
                           *(undefined8 *)((long)&(pmVar40->decoration).input_attachment + 2);
                      *(undefined8 *)((long)&(pmVar41->decoration).index + 2) = uVar12;
                      (pmVar41->decoration).stream = uVar31;
                      (pmVar41->decoration).array_stride = uVar13;
                      (pmVar41->decoration).matrix_stride = uVar14;
                      (pmVar41->decoration).input_attachment = uVar15;
                      (pmVar41->decoration).binding = uVar16;
                      (pmVar41->decoration).offset = uVar17;
                      (pmVar41->decoration).xfb_buffer = uVar18;
                      (pmVar41->decoration).xfb_stride = uVar19;
                      (pmVar41->decoration).builtin_type = BVar3;
                      (pmVar41->decoration).location = uVar20;
                      (pmVar41->decoration).component = uVar21;
                      (pmVar41->decoration).set = uVar22;
                      (pmVar41->decoration).extended.flags.lower =
                           (pmVar40->decoration).extended.flags.lower;
                      ::std::
                      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      ::
                      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                  *)&(pmVar41->decoration).extended.flags.higher,
                                 &(pmVar40->decoration).extended.flags.higher._M_h);
                    }
                    puVar52 = (pmVar40->decoration).extended.values;
                    puVar53 = (pmVar41->decoration).extended.values;
                    for (lVar45 = 9; puVar34 = local_68, pSVar39 = local_58, lVar45 != 0;
                        lVar45 = lVar45 + -1) {
                      *(undefined8 *)puVar53 = *(undefined8 *)puVar52;
                      puVar52 = puVar52 + (ulong)bVar57 * -4 + 2;
                      puVar53 = puVar53 + (ulong)bVar57 * -4 + 2;
                    }
                  }
                }
                uVar50 = uVar50 + 1;
                puVar34 = puVar34 + -1;
              } while (puVar34 != (uint32_t *)0x0);
            }
          }
          else {
            uVar31 = ParsedIR::increase_bound_by(local_98,1);
            pSVar24 = local_a0;
            TVar23.id = local_f8.id;
            SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                      (local_90,(local_a0->arguments).
                                super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size +
                                1);
            pPVar11 = (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                      ptr;
            sVar8 = (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                    buffer_size;
            pPVar11[sVar8].type.id = TVar23.id;
            pPVar11[sVar8].id.id = uVar31;
            pPVar11[sVar8].read_count = 0;
            pPVar11[sVar8].write_count = 0;
            pPVar11[sVar8].alias_global_variable = true;
            (pSVar24->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
                 = sVar8 + 1;
            local_e0._0_4_ = BuiltInPrimitiveId;
            local_f4.id = 0;
            Compiler::
            set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                      ((Compiler *)this,uVar31,&local_f8.id,(StorageClass *)local_e0,
                       (int *)&local_f4,&local_fc.id);
            p_Var25 = local_78;
            local_e0._0_4_ = local_fc.id;
            pmVar40 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_78,(key_type *)local_e0);
            local_f4.id = uVar31;
            pmVar41 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](p_Var25,&local_f4);
            Meta::operator=(pmVar41,pmVar40);
          }
          local_d0._32_8_ = ::std::_Rb_tree_increment((_Rb_tree_node_base *)local_d0._32_8_);
        } while ((_Rb_tree_header *)local_d0._32_8_ != p_Var44);
      }
    }
  }
  else {
    p_Var33 = &::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->function_global_vars,&local_a4)->_M_t;
    ::std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(&added_arg_ids->_M_t,p_Var33);
  }
  return;
LAB_0028aa28:
  p_Var35 = (__node_base_ptr)0x0;
LAB_0028aa2a:
  if ((p_Var35 != (__node_base_ptr)0x0) && (p_Var35->_M_nxt != (_Hash_node_base *)0x0)) {
    pPVar51 = (ParsedIR *)local_e0;
LAB_0028aa3e:
    ::std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)added_arg_ids,(uint *)pPVar51);
  }
switchD_0028a281_caseD_3a:
  if (((((this->msl_options).manual_helper_invocation_updates == true) &&
       (0x4f4b < (this->msl_options).msl_version)) &&
      (*(int *)&(local_f0->super_IVariant).field_0xc == 6)) &&
     (this->needs_helper_invocation == true)) {
    ::std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)added_arg_ids,(uint *)local_d0._32_8_);
  }
  instr = instr + 1;
  if (instr == pIVar1) goto LAB_0028aa8a;
  goto LAB_0028a0c0;
}

Assistant:

void CompilerMSL::extract_global_variables_from_function(uint32_t func_id, std::set<uint32_t> &added_arg_ids,
                                                         unordered_set<uint32_t> &global_var_ids,
                                                         unordered_set<uint32_t> &processed_func_ids)
{
	// Avoid processing a function more than once
	if (processed_func_ids.find(func_id) != processed_func_ids.end())
	{
		// Return function global variables
		added_arg_ids = function_global_vars[func_id];
		return;
	}

	processed_func_ids.insert(func_id);

	auto &func = get<SPIRFunction>(func_id);

	// Recursively establish global args added to functions on which we depend.
	for (auto block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			switch (op)
			{
			case OpLoad:
			case OpInBoundsAccessChain:
			case OpAccessChain:
			case OpPtrAccessChain:
			case OpArrayLength:
			{
				uint32_t base_id = ops[2];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);

				// Use Metal's native frame-buffer fetch API for subpass inputs.
				auto &type = get<SPIRType>(ops[0]);
				if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData &&
				    (!msl_options.use_framebuffer_fetch_subpasses))
				{
					// Implicitly reads gl_FragCoord.
					assert(builtin_frag_coord_id != 0);
					added_arg_ids.insert(builtin_frag_coord_id);
					if (msl_options.multiview)
					{
						// Implicitly reads gl_ViewIndex.
						assert(builtin_view_idx_id != 0);
						added_arg_ids.insert(builtin_view_idx_id);
					}
					else if (msl_options.arrayed_subpass_input)
					{
						// Implicitly reads gl_Layer.
						assert(builtin_layer_id != 0);
						added_arg_ids.insert(builtin_layer_id);
					}
				}

				break;
			}

			case OpFunctionCall:
			{
				// First see if any of the function call args are globals
				for (uint32_t arg_idx = 3; arg_idx < i.length; arg_idx++)
				{
					uint32_t arg_id = ops[arg_idx];
					if (global_var_ids.find(arg_id) != global_var_ids.end())
						added_arg_ids.insert(arg_id);
				}

				// Then recurse into the function itself to extract globals used internally in the function
				uint32_t inner_func_id = ops[2];
				std::set<uint32_t> inner_func_args;
				extract_global_variables_from_function(inner_func_id, inner_func_args, global_var_ids,
				                                       processed_func_ids);
				added_arg_ids.insert(inner_func_args.begin(), inner_func_args.end());
				break;
			}

			case OpStore:
			{
				uint32_t base_id = ops[0];
				if (global_var_ids.find(base_id) != global_var_ids.end())
				{
					added_arg_ids.insert(base_id);

					if (msl_options.input_attachment_is_ds_attachment && base_id == builtin_frag_depth_id)
						writes_to_depth = true;
				}

				uint32_t rvalue_id = ops[1];
				if (global_var_ids.find(rvalue_id) != global_var_ids.end())
					added_arg_ids.insert(rvalue_id);

				if (needs_frag_discard_checks())
					added_arg_ids.insert(builtin_helper_invocation_id);

				break;
			}

			case OpSelect:
			{
				uint32_t base_id = ops[3];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				base_id = ops[4];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			case OpAtomicExchange:
			case OpAtomicCompareExchange:
			case OpAtomicStore:
			case OpAtomicIIncrement:
			case OpAtomicIDecrement:
			case OpAtomicIAdd:
			case OpAtomicFAddEXT:
			case OpAtomicISub:
			case OpAtomicSMin:
			case OpAtomicUMin:
			case OpAtomicSMax:
			case OpAtomicUMax:
			case OpAtomicAnd:
			case OpAtomicOr:
			case OpAtomicXor:
			case OpImageWrite:
			{
				if (needs_frag_discard_checks())
					added_arg_ids.insert(builtin_helper_invocation_id);
				uint32_t ptr = 0;
				if (op == OpAtomicStore || op == OpImageWrite)
					ptr = ops[0];
				else
					ptr = ops[2];
				if (global_var_ids.find(ptr) != global_var_ids.end())
					added_arg_ids.insert(ptr);
				break;
			}

			// Emulate texture2D atomic operations
			case OpImageTexelPointer:
			{
				// When using the pointer, we need to know which variable it is actually loaded from.
				uint32_t base_id = ops[2];
				auto *var = maybe_get_backing_variable(base_id);
				if (var)
				{
					if (atomic_image_vars_emulated.count(var->self) &&
					    !get<SPIRType>(var->basetype).array.empty())
					{
						SPIRV_CROSS_THROW(
								"Cannot emulate array of storage images with atomics. Use MSL 3.1 for native support.");
					}

					if (global_var_ids.find(base_id) != global_var_ids.end())
						added_arg_ids.insert(base_id);
				}
				break;
			}

			case OpExtInst:
			{
				uint32_t extension_set = ops[2];
				if (get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
				{
					auto op_450 = static_cast<GLSLstd450>(ops[3]);
					switch (op_450)
					{
					case GLSLstd450InterpolateAtCentroid:
					case GLSLstd450InterpolateAtSample:
					case GLSLstd450InterpolateAtOffset:
					{
						// For these, we really need the stage-in block. It is theoretically possible to pass the
						// interpolant object, but a) doing so would require us to create an entirely new variable
						// with Interpolant type, and b) if we have a struct or array, handling all the members and
						// elements could get unwieldy fast.
						added_arg_ids.insert(stage_in_var_id);
						break;
					}

					case GLSLstd450Modf:
					case GLSLstd450Frexp:
					{
						uint32_t base_id = ops[5];
						if (global_var_ids.find(base_id) != global_var_ids.end())
							added_arg_ids.insert(base_id);
						break;
					}

					default:
						break;
					}
				}
				break;
			}

			case OpGroupNonUniformInverseBallot:
			{
				added_arg_ids.insert(builtin_subgroup_invocation_id_id);
				break;
			}

			case OpGroupNonUniformBallotFindLSB:
			case OpGroupNonUniformBallotFindMSB:
			{
				added_arg_ids.insert(builtin_subgroup_size_id);
				break;
			}

			case OpGroupNonUniformBallotBitCount:
			{
				auto operation = static_cast<GroupOperation>(ops[3]);
				switch (operation)
				{
				case GroupOperationReduce:
					added_arg_ids.insert(builtin_subgroup_size_id);
					break;
				case GroupOperationInclusiveScan:
				case GroupOperationExclusiveScan:
					added_arg_ids.insert(builtin_subgroup_invocation_id_id);
					break;
				default:
					break;
				}
				break;
			}

			case OpDemoteToHelperInvocation:
				if (needs_manual_helper_invocation_updates() && needs_helper_invocation)
					added_arg_ids.insert(builtin_helper_invocation_id);
				break;

			case OpIsHelperInvocationEXT:
				if (needs_manual_helper_invocation_updates())
					added_arg_ids.insert(builtin_helper_invocation_id);
				break;

			case OpRayQueryInitializeKHR:
			case OpRayQueryProceedKHR:
			case OpRayQueryTerminateKHR:
			case OpRayQueryGenerateIntersectionKHR:
			case OpRayQueryConfirmIntersectionKHR:
			{
				// Ray query accesses memory directly, need check pass down object if using Private storage class.
				uint32_t base_id = ops[0];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			case OpRayQueryGetRayTMinKHR:
			case OpRayQueryGetRayFlagsKHR:
			case OpRayQueryGetWorldRayOriginKHR:
			case OpRayQueryGetWorldRayDirectionKHR:
			case OpRayQueryGetIntersectionCandidateAABBOpaqueKHR:
			case OpRayQueryGetIntersectionTypeKHR:
			case OpRayQueryGetIntersectionTKHR:
			case OpRayQueryGetIntersectionInstanceCustomIndexKHR:
			case OpRayQueryGetIntersectionInstanceIdKHR:
			case OpRayQueryGetIntersectionInstanceShaderBindingTableRecordOffsetKHR:
			case OpRayQueryGetIntersectionGeometryIndexKHR:
			case OpRayQueryGetIntersectionPrimitiveIndexKHR:
			case OpRayQueryGetIntersectionBarycentricsKHR:
			case OpRayQueryGetIntersectionFrontFaceKHR:
			case OpRayQueryGetIntersectionObjectRayDirectionKHR:
			case OpRayQueryGetIntersectionObjectRayOriginKHR:
			case OpRayQueryGetIntersectionObjectToWorldKHR:
			case OpRayQueryGetIntersectionWorldToObjectKHR:
			{
				// Ray query accesses memory directly, need check pass down object if using Private storage class.
				uint32_t base_id = ops[2];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			default:
				break;
			}

			if (needs_manual_helper_invocation_updates() && b.terminator == SPIRBlock::Kill &&
			    needs_helper_invocation)
				added_arg_ids.insert(builtin_helper_invocation_id);

			// TODO: Add all other operations which can affect memory.
			// We should consider a more unified system here to reduce boiler-plate.
			// This kind of analysis is done in several places ...
		}
	}

	function_global_vars[func_id] = added_arg_ids;

	// Add the global variables as arguments to the function
	if (func_id != ir.default_entry_point)
	{
		bool control_point_added_in = false;
		bool control_point_added_out = false;
		bool patch_added_in = false;
		bool patch_added_out = false;

		for (uint32_t arg_id : added_arg_ids)
		{
			auto &var = get<SPIRVariable>(arg_id);
			uint32_t type_id = var.basetype;
			auto *p_type = &get<SPIRType>(type_id);
			BuiltIn bi_type = BuiltIn(get_decoration(arg_id, DecorationBuiltIn));

			bool is_patch = has_decoration(arg_id, DecorationPatch) || is_patch_block(*p_type);
			bool is_block = has_decoration(p_type->self, DecorationBlock);
			bool is_control_point_storage =
			    !is_patch && ((is_tessellation_shader() && var.storage == StorageClassInput) ||
			                  (is_tesc_shader() && var.storage == StorageClassOutput));
			bool is_patch_block_storage = is_patch && is_block && var.storage == StorageClassOutput;
			bool is_builtin = is_builtin_variable(var);
			bool variable_is_stage_io =
					!is_builtin || bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
					bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance ||
					p_type->basetype == SPIRType::Struct;
			bool is_redirected_to_global_stage_io = (is_control_point_storage || is_patch_block_storage) &&
			                                        variable_is_stage_io;

			// If output is masked it is not considered part of the global stage IO interface.
			if (is_redirected_to_global_stage_io && var.storage == StorageClassOutput)
				is_redirected_to_global_stage_io = !is_stage_output_variable_masked(var);

			if (is_redirected_to_global_stage_io)
			{
				// Tessellation control shaders see inputs and per-point outputs as arrays.
				// Similarly, tessellation evaluation shaders see per-point inputs as arrays.
				// We collected them into a structure; we must pass the array of this
				// structure to the function.
				std::string name;
				if (is_patch)
					name = var.storage == StorageClassInput ? patch_stage_in_var_name : patch_stage_out_var_name;
				else
					name = var.storage == StorageClassInput ? "gl_in" : "gl_out";

				if (var.storage == StorageClassOutput && has_decoration(p_type->self, DecorationBlock))
				{
					// If we're redirecting a block, we might still need to access the original block
					// variable if we're masking some members.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(p_type->member_types.size()); mbr_idx++)
					{
						if (is_stage_output_block_member_masked(var, mbr_idx, true))
						{
							func.add_parameter(var.basetype, var.self, true);
							break;
						}
					}
				}

				if (var.storage == StorageClassInput)
				{
					auto &added_in = is_patch ? patch_added_in : control_point_added_in;
					if (added_in)
						continue;
					arg_id = is_patch ? patch_stage_in_var_id : stage_in_ptr_var_id;
					added_in = true;
				}
				else if (var.storage == StorageClassOutput)
				{
					auto &added_out = is_patch ? patch_added_out : control_point_added_out;
					if (added_out)
						continue;
					arg_id = is_patch ? patch_stage_out_var_id : stage_out_ptr_var_id;
					added_out = true;
				}

				type_id = get<SPIRVariable>(arg_id).basetype;
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				set_name(next_id, name);
				if (is_tese_shader() && msl_options.raw_buffer_tese_input && var.storage == StorageClassInput)
					set_decoration(next_id, DecorationNonWritable);
			}
			else if (is_builtin && has_decoration(p_type->self, DecorationBlock))
			{
				// Get the pointee type
				type_id = get_pointee_type_id(type_id);
				p_type = &get<SPIRType>(type_id);

				uint32_t mbr_idx = 0;
				for (auto &mbr_type_id : p_type->member_types)
				{
					BuiltIn builtin = BuiltInMax;
					is_builtin = is_member_builtin(*p_type, mbr_idx, &builtin);
					if (is_builtin && has_active_builtin(builtin, var.storage))
					{
						// Add a arg variable with the same type and decorations as the member
						uint32_t next_ids = ir.increase_bound_by(2);
						uint32_t ptr_type_id = next_ids + 0;
						uint32_t var_id = next_ids + 1;

						// Make sure we have an actual pointer type,
						// so that we will get the appropriate address space when declaring these builtins.
						auto &ptr = set<SPIRType>(ptr_type_id, get<SPIRType>(mbr_type_id));
						ptr.self = mbr_type_id;
						ptr.storage = var.storage;
						ptr.pointer = true;
						ptr.pointer_depth++;
						ptr.parent_type = mbr_type_id;

						func.add_parameter(mbr_type_id, var_id, true);
						set<SPIRVariable>(var_id, ptr_type_id, StorageClassFunction);
						ir.meta[var_id].decoration = ir.meta[type_id].members[mbr_idx];
					}
					mbr_idx++;
				}
			}
			else
			{
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				// Ensure the new variable has all the same meta info
				ir.meta[next_id] = ir.meta[arg_id];
			}
		}
	}
}